

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O1

int file_close(jas_stream_obj_t *obj)

{
  int iVar1;
  
  iVar1 = jas_getdbglevel();
  if (99 < iVar1) {
    jas_eprintf("file_close(%p)\n",obj);
  }
  iVar1 = close(*obj);
  if ((*(byte *)((long)obj + 4) & 1) != 0) {
    unlink((char *)((long)obj + 8));
  }
  jas_free(obj);
  return iVar1;
}

Assistant:

static int file_close(jas_stream_obj_t *obj)
{
	int ret;
	jas_stream_fileobj_t *fileobj;
	JAS_DBGLOG(100, ("file_close(%p)\n", obj));
	fileobj = JAS_CAST(jas_stream_fileobj_t *, obj);
	ret = close(fileobj->fd);
	if (fileobj->flags & JAS_STREAM_FILEOBJ_DELONCLOSE) {
		unlink(fileobj->pathname);
	}
	jas_free(fileobj);
	return ret;
}